

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

FArchive * __thiscall
FArchive::SerializePointer(FArchive *this,void *ptrbase,BYTE **ptr,DWORD elemSize)

{
  DWORD DVar1;
  DWORD local_28;
  DWORD w;
  DWORD elemSize_local;
  BYTE **ptr_local;
  void *ptrbase_local;
  FArchive *this_local;
  
  if ((this->m_Storing & 1U) == 0) {
    DVar1 = ReadCount(this);
    if (DVar1 == 0xffffffff) {
      *ptr = (BYTE *)0x0;
    }
    else {
      *ptr = (BYTE *)((long)ptrbase + (ulong)(DVar1 * elemSize));
    }
  }
  else {
    if (*ptr == (BYTE *)0x0) {
      local_28 = 0xffffffff;
    }
    else {
      local_28 = (DWORD)((ulong)((long)*ptr - (long)ptrbase) / (ulong)elemSize);
    }
    WriteCount(this,local_28);
  }
  return this;
}

Assistant:

FArchive &FArchive::SerializePointer (void *ptrbase, BYTE **ptr, DWORD elemSize)
{
	DWORD w;

	if (m_Storing)
	{
		if (*(void **)ptr)
		{
			w = DWORD(((size_t)*ptr - (size_t)ptrbase) / elemSize);
		}
		else
		{
			w = ~0u;
		}
		WriteCount (w);
	}
	else
	{
		w = ReadCount ();
		if (w != ~0u)
		{
			*(void **)ptr = (BYTE *)ptrbase + w * elemSize;
		}
		else
		{
			*(void **)ptr = NULL;
		}
	}
	return *this;
}